

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void prvTidyParseDefList(TidyDocImpl *doc,Node *list,GetTokenMode mode)

{
  uint uVar1;
  Lexer *pLVar2;
  Dict *pDVar3;
  Dict *pDVar4;
  Node *pNVar5;
  Bool BVar6;
  int iVar7;
  Node *parent;
  Node *node;
  Node **ppNVar8;
  uint code;
  Node *pNVar9;
  
  if ((list->tag->model & 1) != 0) {
    return;
  }
  pLVar2 = doc->lexer;
  pLVar2->insert = (IStack *)0x0;
  node = prvTidyGetToken(doc,IgnoreWhitespace);
joined_r0x001401fa:
  if (node == (Node *)0x0) {
LAB_001404da:
    node = (Node *)0x0;
    code = 0x25a;
LAB_001404e7:
    prvTidyReport(doc,list,node,code);
    return;
  }
  do {
    if ((node->tag == list->tag) && (node->type == EndTag)) {
      prvTidyFreeNode(doc,node);
      list->closed = yes;
      return;
    }
    BVar6 = InsertMisc(list,node);
    if (BVar6 == no) {
      BVar6 = prvTidynodeIsText(node);
      if (BVar6 != no) {
        prvTidyUngetToken(doc);
        node = prvTidyInferredTag(doc,TidyTag_DT);
        prvTidyReport(doc,list,node,0x261);
      }
      pDVar3 = node->tag;
      if (pDVar3 != (Dict *)0x0) {
        if (node->type == EndTag) {
          pNVar9 = list;
          if ((node == (Node *)0x0) || (pDVar3->id != TidyTag_FORM)) {
            do {
              pNVar9 = pNVar9->parent;
              if (pNVar9 == (Node *)0x0) {
                iVar7 = 0;
                goto LAB_00140300;
              }
              pDVar4 = pNVar9->tag;
              if ((pDVar4 != (Dict *)0x0) && (pDVar4->id == TidyTag_BODY)) goto LAB_00140298;
            } while (pDVar3 != pDVar4);
            prvTidyReport(doc,list,node,0x259);
            prvTidyUngetToken(doc);
            iVar7 = 1;
          }
          else {
            *(byte *)&doc->badForm = (byte)doc->badForm | 1;
LAB_00140298:
            prvTidyReport(doc,list,node,0x235);
            prvTidyFreeNode(doc,node);
            iVar7 = 2;
          }
LAB_00140300:
          if (iVar7 == 2) goto LAB_001403db;
          if (iVar7 != 0) {
            return;
          }
        }
        if ((node == (Node *)0x0) || (pDVar3 = node->tag, pDVar3 == (Dict *)0x0)) {
LAB_0014033c:
          prvTidyUngetToken(doc);
          uVar1 = node->tag->model;
          if ((uVar1 & 0x18) == 0) {
            code = 0x27e;
            goto LAB_001404e7;
          }
          if (((uVar1 & 0x10) == 0) && (pLVar2->excludeBlocks != no)) {
            return;
          }
          node = prvTidyInferredTag(doc,TidyTag_DD);
          prvTidyReport(doc,list,node,0x261);
        }
        else {
          if (pDVar3->id == TidyTag_CENTER) break;
          if ((pDVar3 == (Dict *)0x0) ||
             ((pDVar3->id != TidyTag_DT && ((pDVar3 == (Dict *)0x0 || (pDVar3->id != TidyTag_DD)))))
             ) goto LAB_0014033c;
        }
        if (node->type != EndTag) {
          node->parent = list;
          pNVar9 = list->last;
          node->prev = pNVar9;
          ppNVar8 = &pNVar9->next;
          if (pNVar9 == (Node *)0x0) {
            ppNVar8 = &list->content;
          }
          *ppNVar8 = node;
          list->last = node;
          ParseTag(doc,node,IgnoreWhitespace);
          goto LAB_001403db;
        }
      }
      prvTidyReport(doc,list,node,0x235);
      prvTidyFreeNode(doc,node);
    }
LAB_001403db:
    node = prvTidyGetToken(doc,IgnoreWhitespace);
    if (node == (Node *)0x0) goto LAB_001404da;
  } while( true );
  pNVar9 = list->content;
  pNVar5 = list->parent;
  node->parent = pNVar5;
  if (pNVar9 == (Node *)0x0) {
    node->next = list;
    node->prev = list->prev;
    list->prev = node;
    if (node->prev != (Node *)0x0) {
      node->prev->next = node;
    }
    if (pNVar5->content == list) {
      pNVar5->content = node;
    }
  }
  else {
    if ((pNVar5 == (Node *)0x0) || (pNVar5->last != list)) {
      pNVar9 = list->next;
      node->next = pNVar9;
      if (pNVar9 != (Node *)0x0) {
        ppNVar8 = &pNVar9->prev;
        goto LAB_0014044e;
      }
    }
    else {
      ppNVar8 = &pNVar5->last;
LAB_0014044e:
      *ppNVar8 = node;
    }
    list->next = node;
    node->prev = list;
  }
  pNVar9 = node->parent;
  pLVar2->excludeBlocks = no;
  ParseTag(doc,node,mode);
  pLVar2->excludeBlocks = yes;
  if (pNVar9->last != node) goto LAB_001404c4;
  list = prvTidyInferredTag(doc,TidyTag_DL);
  pNVar9 = node->parent;
  list->parent = pNVar9;
  if ((pNVar9 == (Node *)0x0) || (pNVar9->last != node)) {
    pNVar9 = node->next;
    list->next = pNVar9;
    if (pNVar9 != (Node *)0x0) {
      ppNVar8 = &pNVar9->prev;
      goto LAB_001404b9;
    }
  }
  else {
    ppNVar8 = &pNVar9->last;
LAB_001404b9:
    *ppNVar8 = list;
  }
  node->next = list;
  list->prev = node;
LAB_001404c4:
  node = prvTidyGetToken(doc,IgnoreWhitespace);
  goto joined_r0x001401fa;
}

Assistant:

void TY_(ParseDefList)(TidyDocImpl* doc, Node *list, GetTokenMode mode)
{
    Lexer* lexer = doc->lexer;
    Node *node, *parent;

    if (list->tag->model & CM_EMPTY)
        return;

    lexer->insert = NULL;  /* defer implicit inline start tags */

    while ((node = TY_(GetToken)( doc, IgnoreWhitespace)) != NULL)
    {
        if (node->tag == list->tag && node->type == EndTag)
        {
            TY_(FreeNode)( doc, node);
            list->closed = yes;
            return;
        }

        /* deal with comments etc. */
        if (InsertMisc(list, node))
            continue;

        if (TY_(nodeIsText)(node))
        {
            TY_(UngetToken)( doc );
            node = TY_(InferredTag)(doc, TidyTag_DT);
            TY_(Report)(doc, list, node, MISSING_STARTTAG);
        }

        if (node->tag == NULL)
        {
            TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        /* 
          if this is the end tag for an ancestor element
          then infer end tag for this element
        */
        if (node->type == EndTag)
        {
            Bool discardIt = no;
            if ( nodeIsFORM(node) )
            {
                BadForm( doc );
                TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node );
                continue;
            }

            for (parent = list->parent;
                    parent != NULL; parent = parent->parent)
            {
               /* Do not match across BODY to avoid infinite loop
                  between ParseBody and this parser,
                  See http://tidy.sf.net/bug/1098012. */
                if (nodeIsBODY(parent))
                {
                    discardIt = yes;
                    break;
                }
                if (node->tag == parent->tag)
                {
                    TY_(Report)(doc, list, node, MISSING_ENDTAG_BEFORE);

                    TY_(UngetToken)( doc );
                    return;
                }
            }
            if (discardIt)
            {
                TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
                continue;
            }
        }

        /* center in a dt or a dl breaks the dl list in two */
        if ( nodeIsCENTER(node) )
        {
            if (list->content)
                TY_(InsertNodeAfterElement)(list, node);
            else /* trim empty dl list */
            {
                TY_(InsertNodeBeforeElement)(list, node);
            }

            /* #426885 - fix by Glenn Carroll 19 Apr 00, and
                         Gary Dechaines 11 Aug 00 */
            /* ParseTag can destroy node, if it finds that
             * this <center> is followed immediately by </center>.
             * It's awkward but necessary to determine if this
             * has happened.
             */
            parent = node->parent;

            /* and parse contents of center */
            lexer->excludeBlocks = no;
            ParseTag( doc, node, mode);
            lexer->excludeBlocks = yes;

            /* now create a new dl element,
             * unless node has been blown away because the
             * center was empty, as above.
             */
            if (parent->last == node)
            {
                list = TY_(InferredTag)(doc, TidyTag_DL);
                TY_(InsertNodeAfterElement)(node, list);
            }
            continue;
        }

        if ( !(nodeIsDT(node) || nodeIsDD(node)) )
        {
            TY_(UngetToken)( doc );

            if (!(node->tag->model & (CM_BLOCK | CM_INLINE)))
            {
                TY_(Report)(doc, list, node, TAG_NOT_ALLOWED_IN);
                return;
            }

            /* if DD appeared directly in BODY then exclude blocks */
            if (!(node->tag->model & CM_INLINE) && lexer->excludeBlocks)
                return;

            node = TY_(InferredTag)(doc, TidyTag_DD);
            TY_(Report)(doc, list, node, MISSING_STARTTAG);
        }

        if (node->type == EndTag)
        {
            TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }
        
        /* node should be <DT> or <DD>*/
        TY_(InsertNodeAtEnd)(list, node);
        ParseTag( doc, node, IgnoreWhitespace);
    }

    TY_(Report)(doc, list, node, MISSING_ENDTAG_FOR);
}